

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pstd.h
# Opt level: O2

void __thiscall
pstd::
vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
::clear(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        *this)

{
  long lVar1;
  int i;
  ulong uVar2;
  
  lVar1 = 0;
  for (uVar2 = 0; uVar2 < this->nStored; uVar2 = uVar2 + 1) {
    std::__cxx11::string::~string((string *)((long)&(this->ptr->_M_dataplus)._M_p + lVar1));
    lVar1 = lVar1 + 0x20;
  }
  this->nStored = 0;
  return;
}

Assistant:

void clear() {
        for (int i = 0; i < nStored; ++i)
            alloc.destroy(&ptr[i]);
        nStored = 0;
    }